

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

int64_t __thiscall leveldb::DBImpl::TEST_MaxNextLevelOverlappingBytes(DBImpl *this)

{
  int64_t iVar1;
  
  std::mutex::lock(&(this->mutex_).mu_);
  iVar1 = VersionSet::MaxNextLevelOverlappingBytes(this->versions_);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return iVar1;
}

Assistant:

int64_t DBImpl::TEST_MaxNextLevelOverlappingBytes() {
  MutexLock l(&mutex_);
  return versions_->MaxNextLevelOverlappingBytes();
}